

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O2

void __thiscall DbCheckPostLower::EnsureValidEndBoundary(DbCheckPostLower *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *pLVar4;
  BranchInstr *pBVar5;
  
  bVar2 = IsEndBoundary(this,instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x12e,"(IsEndBoundary(instr))",
                       "Nested helper call. Not a valid end boundary.");
    if (!bVar2) goto LAB_003ebcd8;
    *puVar3 = 0;
  }
  if ((instr->m_kind == InstrKindProfiledLabel) || (instr->m_kind == InstrKindLabel)) {
    pLVar4 = IR::Instr::AsLabelInstr(instr);
    pLVar4 = IR::Instr::GetNextNonEmptyLabel(&pLVar4->super_Instr);
    if ((pLVar4->field_0x78 & 2) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x132,"(false)","Nested helper call. Falling through a helper label.");
      if (!bVar2) goto LAB_003ebcd8;
      *puVar3 = 0;
    }
  }
  if (instr->m_opcode == JMP) {
    pBVar5 = IR::Instr::AsBranchInstr(instr);
    pLVar4 = IR::Instr::GetNextNonEmptyLabel(&pBVar5->m_branchTarget->super_Instr);
    if ((pLVar4->field_0x78 & 2) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x138,"(false)","Nested helper call. Jumping to a helper label.");
      if (!bVar2) {
LAB_003ebcd8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void
DbCheckPostLower::EnsureValidEndBoundary(IR::Instr *instr)
{
    AssertMsg(IsEndBoundary(instr), "Nested helper call. Not a valid end boundary.");
    if (instr->IsLabelInstr() && instr->AsLabelInstr()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Falling through a helper label.");
    }

    if (instr->m_opcode == Js::OpCode::JMP && instr->AsBranchInstr()->GetTarget()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Jumping to a helper label.");
    }
}